

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

int compar_string(void *pa,void *pb)

{
  char *sb;
  char *sa;
  void *pb_local;
  void *pa_local;
  
  if (pa == (void *)0x0) {
    pa_local._4_4_ = 0;
    if (pb != (void *)0x0) {
      pa_local._4_4_ = -1;
    }
  }
  else if (pb == (void *)0x0) {
    pa_local._4_4_ = 1;
  }
  else {
    pa_local._4_4_ = strcmp((char *)pa,(char *)pb);
  }
  return pa_local._4_4_;
}

Assistant:

static int compar_string(const void* pa, const void* pb)
{
  const char* sa = (const char*)pa;
  const char* sb = (const char*)pb;
  if ( !sa ) {
    return (sb) ? -1 : 0;
  }
  else if ( !sb ) {
    return 1;
  }
  return strcmp(sa,sb);
}